

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O1

void __thiscall
QProcessPrivate::setError(QProcessPrivate *this,ProcessError error,QString *description)

{
  char16_t *pcVar1;
  qsizetype qVar2;
  QArrayData *pQVar3;
  char *s;
  long in_FS_OFFSET;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this->processError = (quint8)error;
  if ((description->d).size != 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QString::operator=(&(this->super_QIODevicePrivate).errorString,description);
      return;
    }
    goto LAB_00429d17;
  }
  switch(error) {
  case FailedToStart:
    s = "Process failed to start";
    break;
  case Crashed:
    s = "Process crashed";
    break;
  case Timedout:
    s = "Process operation timed out";
    break;
  case ReadError:
    s = "Error reading from process";
    break;
  case WriteError:
    s = "Error writing to process";
    break;
  case UnknownError:
    if ((this->super_QIODevicePrivate).errorString.d.ptr != (char16_t *)0x0) {
      pQVar3 = &((this->super_QIODevicePrivate).errorString.d.d)->super_QArrayData;
      (this->super_QIODevicePrivate).errorString.d.d = (Data *)0x0;
      (this->super_QIODevicePrivate).errorString.d.ptr = (char16_t *)0x0;
      (this->super_QIODevicePrivate).errorString.d.size = 0;
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
            QArrayData::deallocate(pQVar3,2,0x10);
            return;
          }
          goto LAB_00429d17;
        }
      }
    }
  default:
    goto switchD_00429bf2_default;
  }
  QMetaObject::tr(&local_38,&QProcess::staticMetaObject,s,(char *)0x0,-1);
  pQVar3 = &((this->super_QIODevicePrivate).errorString.d.d)->super_QArrayData;
  pcVar1 = (this->super_QIODevicePrivate).errorString.d.ptr;
  (this->super_QIODevicePrivate).errorString.d.d = local_38.d.d;
  (this->super_QIODevicePrivate).errorString.d.ptr = local_38.d.ptr;
  qVar2 = (this->super_QIODevicePrivate).errorString.d.size;
  (this->super_QIODevicePrivate).errorString.d.size = local_38.d.size;
  local_38.d.d = (Data *)pQVar3;
  local_38.d.ptr = pcVar1;
  local_38.d.size = qVar2;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,2,0x10);
    }
  }
switchD_00429bf2_default:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_00429d17:
  __stack_chk_fail();
}

Assistant:

void QProcessPrivate::setError(QProcess::ProcessError error, const QString &description)
{
    processError = error;
    if (description.isEmpty()) {
        switch (error) {
        case QProcess::FailedToStart:
            errorString = QProcess::tr("Process failed to start");
            break;
        case QProcess::Crashed:
            errorString = QProcess::tr("Process crashed");
            break;
        case QProcess::Timedout:
            errorString = QProcess::tr("Process operation timed out");
            break;
        case QProcess::ReadError:
            errorString = QProcess::tr("Error reading from process");
            break;
        case QProcess::WriteError:
            errorString = QProcess::tr("Error writing to process");
            break;
        case QProcess::UnknownError:
            errorString.clear();
            break;
        }
    } else {
        errorString = description;
    }
}